

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9FFTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  char *pcVar5;
  char *pcVar6;
  Gia_Man_t *pG;
  Gia_Man_t *pGVar7;
  Gia_Man_t *pGold;
  Bmc_ParFf_t Pars;
  char *local_88;
  Gia_Man_t *local_80;
  Bmc_ParFf_t local_78;
  
  local_80 = (Gia_Man_t *)0x0;
  Gia_ParFfSetDefault(&local_78);
  local_88 = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_00230be0:
  while (iVar2 = Extra_UtilGetopt(argc,argv,"ATNKSGkbsfdeunvh"), iVar1 = globalUtilOptind,
        0x61 < iVar2) {
    switch(iVar2) {
    case 0x62:
      local_78.fBasic = local_78.fBasic ^ 1;
      break;
    default:
      goto switchD_00230c05_caseD_63;
    case 100:
      local_78.fDump = local_78.fDump ^ 1;
      break;
    case 0x65:
      local_78.fDumpDelay = local_78.fDumpDelay ^ 1;
      break;
    case 0x66:
      local_78.fFfOnly = local_78.fFfOnly ^ 1;
      break;
    case 0x6b:
      local_78.fNonStrict = local_78.fNonStrict ^ 1;
      break;
    case 0x6e:
      local_78.fDumpNewFaults = local_78.fDumpNewFaults ^ 1;
      break;
    case 0x73:
      local_78.fStartPats = local_78.fStartPats ^ 1;
      break;
    case 0x75:
      local_78.fDumpUntest = local_78.fDumpUntest ^ 1;
      break;
    case 0x76:
      local_78.fVerbose = local_78.fVerbose ^ 1;
    }
  }
  if (iVar2 < 0x4b) {
    if (iVar2 != 0x41) {
      if (iVar2 == 0x47) {
        if (globalUtilOptind < argc) {
          local_88 = argv[globalUtilOptind];
          goto LAB_00230c94;
        }
        pcVar5 = "Command line switch \"-G\" should be followed by string.\n";
        goto LAB_00230dc3;
      }
      if (iVar2 == -1) {
        if (local_78.pFormStr == (char *)0x0 && local_78.Algo == 0) {
          pcVar5 = "Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n";
        }
        else {
          if (local_78.Algo != 0 && local_78.pFormStr != (char *)0x0) {
            pcVar5 = "Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n";
            goto LAB_002311c8;
          }
          if (globalUtilOptind + 1 == argc) {
            local_78.pFileName = argv[globalUtilOptind];
            pFVar4 = fopen(local_78.pFileName,"r");
            if (pFVar4 == (FILE *)0x0) {
              pcVar5 = "Cannot open file \"%s\" with the input test patterns.\n";
              local_88 = local_78.pFileName;
              goto LAB_002312e0;
            }
            fclose(pFVar4);
          }
          pGVar7 = pAbc->pGia;
          if (pGVar7 == (Gia_Man_t *)0x0) {
            pcVar5 = "Abc_CommandAbc9FFTest(): There is no AIG.\n";
          }
          else if ((pGVar7->nRegs == 0) && (local_78.Algo == 1)) {
            pcVar5 = "Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n";
          }
          else {
            if (local_88 == (char *)0x0) {
              pG = (Gia_Man_t *)0x0;
LAB_002312ae:
              if (pG == (Gia_Man_t *)0x0) {
                pG = pGVar7;
              }
              Gia_ManFaultTest(pGVar7,pG,&local_78);
              Gia_ManStopP(&local_80);
              return 0;
            }
            pFVar4 = fopen(local_88,"r");
            if (pFVar4 == (FILE *)0x0) {
              pcVar5 = "Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n";
LAB_002312e0:
              Abc_Print(-1,pcVar5,local_88);
              return 0;
            }
            fclose(pFVar4);
            local_80 = Gia_AigerRead(local_88,0,0);
            if (local_80 == (Gia_Man_t *)0x0) {
              Abc_Print(-1,"Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n",
                        local_88);
              return 0;
            }
            pGVar7 = pAbc->pGia;
            if (pGVar7->vCis->nSize - pGVar7->nRegs == local_80->vCis->nSize - local_80->nRegs) {
              if (pGVar7->vCos->nSize - pGVar7->nRegs == local_80->vCos->nSize - local_80->nRegs) {
                printf("Entered spec AIG from file \"%s\".\n",local_88);
                pGVar7 = pAbc->pGia;
                pG = local_80;
                goto LAB_002312ae;
              }
              Gia_ManStop(local_80);
              pcVar5 = 
              "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n";
            }
            else {
              Gia_ManStop(local_80);
              pcVar5 = 
              "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n";
            }
          }
        }
LAB_002311c8:
        Abc_Print(-1,pcVar5);
        return 0;
      }
      goto switchD_00230c05_caseD_63;
    }
    if (globalUtilOptind < argc) {
      local_78.Algo = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar1 + 1;
      if (4 < (uint)local_78.Algo) goto switchD_00230c05_caseD_63;
      goto LAB_00230be0;
    }
    pcVar5 = "Command line switch \"-A\" should be followed by an integer.\n";
  }
  else {
    switch(iVar2) {
    case 0x4b:
      if (globalUtilOptind < argc) {
        local_78.nCardConstr = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar1 + 1;
        if (local_78.nCardConstr < 1) goto switchD_00230c05_caseD_63;
        goto LAB_00230be0;
      }
      pcVar5 = "Command line switch \"-K\" should be followed by an integer.\n";
      break;
    default:
      goto switchD_00230c05_caseD_63;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
        break;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_78.nIterCheck = uVar3;
LAB_00230cd1:
      globalUtilOptind = iVar1 + 1;
      if ((int)uVar3 < 0) {
switchD_00230c05_caseD_63:
        Abc_Print(-2,"usage: &fftest [-ATNK num] [-kbsfdeunvh] <file> [-G file] [-S str]\n");
        Abc_Print(-2,"\t          performs functional fault test generation\n");
        Abc_Print(-2,"\t-A num  : selects fault model for all gates [default = %d]\n",
                  (ulong)(uint)local_78.Algo);
        Abc_Print(-2,"\t                0: fault model is not selected (use -S str)\n");
        Abc_Print(-2,"\t                1: delay fault testing for sequential circuits\n");
        Abc_Print(-2,"\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n");
        Abc_Print(-2,"\t                3: complement fault: -S ((a&b)^p)\n");
        Abc_Print(-2,"\t                4: functionally observable fault\n");
        Abc_Print(-2,"\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",
                  (ulong)(uint)local_78.nTimeOut);
        Abc_Print(-2,
                  "\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",
                  (ulong)(uint)local_78.nIterCheck);
        Abc_Print(-2,"\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n");
        pcVar6 = "yes";
        pcVar5 = "yes";
        if (local_78.fNonStrict == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n"
                  ,pcVar5);
        pcVar5 = "yes";
        if (local_78.fBasic == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n"
                  ,pcVar5);
        pcVar5 = "yes";
        if (local_78.fStartPats == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n",
                  pcVar5);
        pcVar5 = "yes";
        if (local_78.fFfOnly == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n"
                  ,pcVar5);
        pcVar5 = "yes";
        if (local_78.fDump == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-d      : toggles dumping test patterns into file \"tests.txt\" [default = %s]\n"
                  ,pcVar5);
        pcVar5 = "yes";
        if (local_78.fDumpDelay == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n"
                  ,pcVar5);
        pcVar5 = "yes";
        if (local_78.fDumpUntest == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-u      : toggles dumping untestable faults into \"untest.txt\" [default = %s]\n"
                  ,pcVar5);
        pcVar5 = "yes";
        if (local_78.fDumpNewFaults == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n"
                  ,pcVar5);
        if (local_78.fVerbose == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-v      : toggles printing verbose information [default = %s]\n",pcVar6);
        Abc_Print(-2,"\t-h      : print the command usage\n");
        Abc_Print(-2,"\t<file>  : (optional) file name with input test patterns\n\n");
        Abc_Print(-2,"\t-G file : (optional) file name with the golden model\n\n");
        Abc_Print(-2,"\t-S str  : (optional) string representing the fault model\n");
        Abc_Print(-2,"\t          The following notations are used:\n");
        Abc_Print(-2,"\t            Functional variables: {a,b} (both a and b are always present)\n"
                 );
        Abc_Print(-2,
                  "\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n")
        ;
        Abc_Print(-2,"\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
        Abc_Print(-2,
                  "\t            Parentheses should be used around each operator. Spaces not allowed.\n"
                 );
        Abc_Print(-2,
                  "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n"
                 );
        Abc_Print(-2,"\t            Examples:\n");
        Abc_Print(-2,"\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
        Abc_Print(-2,"\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
        Abc_Print(-2,
                  "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n"
                 );
        Abc_Print(-2,
                  "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n"
                 );
        Abc_Print(-2,"\t              ((a&b)^p)             complement at the output\n");
        Abc_Print(-2,
                  "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n"
                 );
        Abc_Print(-2,
                  "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n"
                 );
        Abc_Print(-2,"\t              (p?(a|b):(a&b))       replace AND by OR\n");
        return 1;
      }
      goto LAB_00230be0;
    case 0x53:
      if (globalUtilOptind < argc) {
        local_78.pFormStr = argv[globalUtilOptind];
LAB_00230c94:
        globalUtilOptind = globalUtilOptind + 1;
        goto LAB_00230be0;
      }
      pcVar5 = "Command line switch \"-S\" should be followed by string.\n";
      break;
    case 0x54:
      if (globalUtilOptind < argc) {
        uVar3 = atoi(argv[globalUtilOptind]);
        local_78.nTimeOut = uVar3;
        goto LAB_00230cd1;
      }
      pcVar5 = "Command line switch \"-T\" should be followed by an integer.\n";
    }
  }
LAB_00230dc3:
  Abc_Print(-1,pcVar5);
  goto switchD_00230c05_caseD_63;
}

Assistant:

int Abc_CommandAbc9FFTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ParFfSetDefault( Bmc_ParFf_t * p );
    extern void Gia_ManFaultTest( Gia_Man_t * p, Gia_Man_t * pG, Bmc_ParFf_t * pPars );
    Bmc_ParFf_t Pars, * pPars = &Pars;
    char * pFileName = NULL;
    Gia_Man_t * pGold = NULL;
    int c;
    Gia_ParFfSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ATNKSGkbsfdeunvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->Algo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Algo < 0 || pPars->Algo > 4 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterCheck = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterCheck < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCardConstr = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCardConstr <= 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                goto usage;
            }
            pPars->pFormStr = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by string.\n" );
                goto usage;
            }
            pFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'k':
            pPars->fNonStrict ^= 1;
            break;
        case 'b':
            pPars->fBasic ^= 1;
            break;
        case 's':
            pPars->fStartPats ^= 1;
            break;
        case 'f':
            pPars->fFfOnly ^= 1;
            break;
        case 'd':
            pPars->fDump ^= 1;
            break;
        case 'e':
            pPars->fDumpDelay ^= 1;
            break;
        case 'u':
            pPars->fDumpUntest ^= 1;
            break;
        case 'n':
            pPars->fDumpNewFaults ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->Algo == 0 && pPars->pFormStr == NULL )
    {
        Abc_Print( -1, "Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n" );
        return 0;
    }
    if ( pPars->Algo != 0 && pPars->pFormStr != NULL )
    {
        Abc_Print( -1, "Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n" );
        return 0;
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        FILE * pFile;
        pPars->pFileName = argv[globalUtilOptind];
        pFile = fopen( pPars->pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open file \"%s\" with the input test patterns.\n", pPars->pFileName );
            return 0;
        }
        fclose( pFile );
    }
    // check other conditions
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 && pPars->Algo == 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n" );
        return 0;
    }
    // check if the file is valid
    if ( pFileName )
    {
        FILE * pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n", pFileName );
            return 0;
        }
        fclose( pFile );
        pGold = Gia_AigerRead( pFileName, 0, 0 );
        if ( pGold == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n", pFileName );
            return 0;
        }
        if ( Gia_ManPiNum(pAbc->pGia) != Gia_ManPiNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n" );
            return 0;
        }
        if ( Gia_ManPoNum(pAbc->pGia) != Gia_ManPoNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n" );
            return 0;
        }
        printf( "Entered spec AIG from file \"%s\".\n", pFileName );
    }
    Gia_ManFaultTest( pAbc->pGia, pGold ? pGold : pAbc->pGia, pPars );
    Gia_ManStopP( &pGold );
    return 0;

usage:
    Abc_Print( -2, "usage: &fftest [-ATNK num] [-kbsfdeunvh] <file> [-G file] [-S str]\n" );
    Abc_Print( -2, "\t          performs functional fault test generation\n" );
    Abc_Print( -2, "\t-A num  : selects fault model for all gates [default = %d]\n", pPars->Algo );
    Abc_Print( -2, "\t                0: fault model is not selected (use -S str)\n" );
    Abc_Print( -2, "\t                1: delay fault testing for sequential circuits\n" );
    Abc_Print( -2, "\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n" );
    Abc_Print( -2, "\t                3: complement fault: -S ((a&b)^p)\n" );
    Abc_Print( -2, "\t                4: functionally observable fault\n" );
    Abc_Print( -2, "\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",        pPars->nTimeOut );
    Abc_Print( -2, "\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",     pPars->nIterCheck );
    Abc_Print( -2, "\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n" );
    Abc_Print( -2, "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n",pPars->fNonStrict?  "yes": "no" );
    Abc_Print( -2, "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n", pPars->fBasic?      "yes": "no" );
    Abc_Print( -2, "\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n",    pPars->fStartPats?  "yes": "no" );
    Abc_Print( -2, "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n",          pPars->fFfOnly?     "yes": "no" );
    Abc_Print( -2, "\t-d      : toggles dumping test patterns into file \"tests.txt\" [default = %s]\n", pPars->fDump?       "yes": "no" );
    Abc_Print( -2, "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n", pPars->fDumpDelay? "yes": "no" );
    Abc_Print( -2, "\t-u      : toggles dumping untestable faults into \"untest.txt\" [default = %s]\n", pPars->fDumpUntest? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n", pPars->fDumpNewFaults? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggles printing verbose information [default = %s]\n",                  pPars->fVerbose?    "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file>  : (optional) file name with input test patterns\n\n");
    Abc_Print( -2, "\t-G file : (optional) file name with the golden model\n\n");
    Abc_Print( -2, "\t-S str  : (optional) string representing the fault model\n");
    Abc_Print( -2, "\t          The following notations are used:\n");
    Abc_Print( -2, "\t            Functional variables: {a,b} (both a and b are always present)\n");
    Abc_Print( -2, "\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n");
    Abc_Print( -2, "\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
    Abc_Print( -2, "\t            Parentheses should be used around each operator. Spaces not allowed.\n");
    Abc_Print( -2, "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n");
    Abc_Print( -2, "\t            Examples:\n");
    Abc_Print( -2, "\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
    Abc_Print( -2, "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n");
    Abc_Print( -2, "\t              ((a&b)^p)             complement at the output\n");
    Abc_Print( -2, "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n");
    Abc_Print( -2, "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n");
    Abc_Print( -2, "\t              (p?(a|b):(a&b))       replace AND by OR\n");    
    return 1;
}